

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

Declaration * __thiscall
CPP::WriteInitialization::findDeclaration
          (Declaration *__return_storage_ptr__,WriteInitialization *this,QString *name)

{
  DomWidget *ui_widget;
  DomAction *ui_action;
  DomButtonGroup *ui_group;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ui_widget = Driver::widgetByName(this->m_driver,name);
  if (ui_widget == (DomWidget *)0x0) {
    ui_action = Driver::actionByName(this->m_driver,name);
    if (ui_action == (DomAction *)0x0) {
      ui_group = Driver::findButtonGroup(this->m_driver,name);
      if (ui_group == (DomButtonGroup *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          (__return_storage_ptr__->className).d.ptr = (char16_t *)0x0;
          (__return_storage_ptr__->className).d.size = 0;
          (__return_storage_ptr__->name).d.size = 0;
          (__return_storage_ptr__->className).d.d = (Data *)0x0;
          (__return_storage_ptr__->name).d.d = (Data *)0x0;
          (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
          return __return_storage_ptr__;
        }
        goto LAB_0012dbaf;
      }
      Driver::findOrInsertButtonGroup(&__return_storage_ptr__->name,this->m_driver,ui_group);
      (__return_storage_ptr__->className).d.d = (Data *)0x0;
      (__return_storage_ptr__->className).d.ptr = L"QButtonGroup";
      (__return_storage_ptr__->className).d.size = 0xc;
    }
    else {
      Driver::findOrInsertAction(&__return_storage_ptr__->name,this->m_driver,ui_action);
      (__return_storage_ptr__->className).d.d = (Data *)0x0;
      (__return_storage_ptr__->className).d.ptr = L"QAction";
      (__return_storage_ptr__->className).d.size = 7;
    }
    local_40.size = 0;
    local_40.ptr = (char16_t *)0x0;
    local_40.d = (Data *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0012dbaf;
  }
  else {
    Driver::findOrInsertWidget(&__return_storage_ptr__->name,this->m_driver,ui_widget);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0012dbaf:
      __stack_chk_fail();
    }
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&(__return_storage_ptr__->className).d,(QArrayDataPointer<char16_t> *)ui_widget);
  }
  return __return_storage_ptr__;
}

Assistant:

WriteInitialization::Declaration WriteInitialization::findDeclaration(const QString &name)
{
    if (const DomWidget *widget = m_driver->widgetByName(name))
        return {m_driver->findOrInsertWidget(widget), widget->attributeClass()};
    if (const DomAction *action = m_driver->actionByName(name))
        return {m_driver->findOrInsertAction(action), QStringLiteral("QAction")};
    if (const DomButtonGroup *group = m_driver->findButtonGroup(name))
         return {m_driver->findOrInsertButtonGroup(group), QStringLiteral("QButtonGroup")};
    return {};
}